

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O1

void pass2_no_dither(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize)

{
  int iVar1;
  int iVar2;
  hist3d ppahVar3;
  uchar *puVar4;
  int *piVar5;
  hist2d pahVar6;
  uchar uVar7;
  uint c0;
  my_cquantize_ptr cquantize_00;
  int in_R9D;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long local_70;
  
  iVar1 = oim->sy;
  if (0 < (long)iVar1) {
    iVar2 = oim->sx;
    ppahVar3 = cquantize->histogram;
    local_70 = 0;
    do {
      if (0 < iVar2) {
        puVar4 = nim->pixels[local_70];
        piVar5 = oim->tpixels[local_70];
        lVar10 = 0;
        iVar9 = iVar2 + 1;
        do {
          uVar8 = piVar5[lVar10];
          if ((oim->transparent < 0) || (oim->transparent != uVar8)) {
            cquantize_00 = (my_cquantize_ptr)(ulong)(uVar8 >> 0x13 & 0x1f);
            c0 = uVar8 >> 10 & 0x3f;
            uVar8 = uVar8 >> 3 & 0x1f;
            uVar11 = c0 << 6;
            pahVar6 = ppahVar3[(long)cquantize_00];
            if (*(short *)((long)*pahVar6 + (ulong)uVar8 * 2 + (ulong)uVar11) == 0) {
              fill_inverse_cmap(nim,(gdImagePtr)cquantize,cquantize_00,c0,uVar8,in_R9D);
            }
            uVar7 = *(char *)((long)*pahVar6 + (ulong)uVar8 * 2 + (ulong)uVar11) + 0xff;
          }
          else {
            uVar7 = (uchar)nim->colorsTotal;
          }
          puVar4[lVar10] = uVar7;
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
      }
      local_70 = local_70 + 1;
    } while (local_70 != iVar1);
  }
  return;
}

Assistant:

METHODDEF (void)
pass2_no_dither (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize)
{
	register int *inptr;
	register unsigned char *outptr;
	int width = oim->sx;
	int num_rows = oim->sy;
	hist3d histogram = cquantize->histogram;
	register int c0, c1, c2;
	int row;
	JDIMENSION col;
	register histptr cachep;


	for (row = 0; row < num_rows; row++) {
		inptr = input_buf[row];
		outptr = output_buf[row];
		for (col = width; col > 0; col--) {
			/* get pixel value and index into the cache */
			int r, g, b;
			r = gdTrueColorGetRed (*inptr);
			g = gdTrueColorGetGreen (*inptr);
			/*
			   2.0.24: inptr must not be incremented until after
			   transparency check, if any. Thanks to "Super Pikeman."
			 */
			b = gdTrueColorGetBlue (*inptr);

			/* If the pixel is transparent, we assign it the palette index that
			 * will later be added at the end of the palette as the transparent
			 * index. */
			if ((oim->transparent >= 0) && (oim->transparent == *inptr)) {
				*outptr++ = nim->colorsTotal;
				inptr++;
				continue;
			}
			inptr++;
			c0 = r >> C0_SHIFT;
			c1 = g >> C1_SHIFT;
			c2 = b >> C2_SHIFT;
			cachep = &histogram[c0][c1][c2];
			/* If we have not seen this color before, find nearest colormap entry */
			/* and update the cache */
			if (*cachep == 0)
				fill_inverse_cmap (oim, nim, cquantize, c0, c1, c2);
			/* Now emit the colormap index for this cell */
			*outptr++ = (*cachep - 1);
		}
	}
}